

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

void __thiscall
flow::CallInstr::CallInstr
          (CallInstr *this,IRBuiltinFunction *callee,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args,string *name)

{
  LiteralType ty;
  Signature *this_00;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  string *local_28;
  string *name_local;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_local;
  IRBuiltinFunction *callee_local;
  CallInstr *this_local;
  
  local_28 = name;
  name_local = (string *)args;
  args_local = (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)callee;
  callee_local = (IRBuiltinFunction *)this;
  this_00 = IRBuiltinFunction::signature(callee);
  ty = Signature::returnType(this_00);
  join<flow::IRBuiltinFunction*,flow::Value*>
            (&local_40,(flow *)&args_local,(IRBuiltinFunction **)name_local,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)name);
  Instr::Instr(&this->super_Instr,ty,&local_40,local_28);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_40);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__CallInstr_002ba2b8;
  return;
}

Assistant:

CallInstr::CallInstr(IRBuiltinFunction* callee, const std::vector<Value*>& args,
                     const std::string& name)
    : Instr(callee->signature().returnType(), join(callee, args), name) {}